

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O1

map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
* __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeBrandDepMap
          (map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
           *__return_storage_ptr__,CapnpcCppMain *this,TemplateContext *templateContext,
          Schema schema)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  Branch *pBVar5;
  Method method;
  Method method_00;
  Schema SVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  short sVar9;
  mapped_type *pmVar10;
  Schema SVar11;
  StructSchema SVar12;
  ElementCount index;
  uint index_00;
  unsigned_long i;
  ulong uVar13;
  Type TVar14;
  StringPtr suffix;
  StringPtr suffix_00;
  NullableValue<kj::StringTree> dep_2;
  NullableValue<kj::StringTree> dep;
  uint location_2;
  uint location_1;
  InterfaceSchema interface;
  uint location;
  MethodList methods;
  Maybe<kj::StringTree> local_200;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [52];
  uint local_17c;
  Schema local_178;
  anon_union_56_1_a8c68091_for_NullableValue<kj::StringTree>_2 local_170;
  Schema local_138;
  Schema local_130;
  RawBrandedSchema *local_128;
  undefined2 uStack_120;
  undefined4 uStack_11e;
  undefined2 uStack_11a;
  SegmentReader *local_118;
  WirePointer *pWStack_110;
  ArrayDisposer *local_108;
  WirePointer *pWStack_100;
  StructDataBitCount local_f8;
  StructPointerCount SStack_f4;
  undefined2 uStack_f2;
  ArrayDisposer *pAStack_f0;
  SuperclassList local_e0;
  RawBrandedSchema *local_a8;
  CapTableReader *pCStack_a0;
  SegmentReader *local_98;
  WirePointer *pWStack_90;
  ArrayDisposer *local_88;
  WirePointer *pWStack_80;
  StructDataBitCount local_78;
  StructPointerCount SStack_74;
  undefined2 uStack_72;
  ArrayDisposer *pAStack_70;
  MethodList local_68;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138.raw = (RawBrandedSchema *)templateContext;
  Schema::getProto((Reader *)local_1c0,&local_138);
  if ((uint)auStack_1b0._16_4_ < 0x70) {
    sVar9 = 0;
  }
  else {
    sVar9 = *(short *)(auStack_1b0._0_8_ + 0xc);
  }
  if (sVar9 == 1) {
    local_1c0._0_8_ = Schema::asStruct(&local_138);
    StructSchema::getFields((FieldList *)&local_e0,(StructSchema *)local_1c0);
    if (local_e0.list.reader.elementCount != 0) {
      index_00 = 0;
      do {
        SVar11.raw._4_4_ = local_e0.parent.super_Schema.raw._4_4_;
        SVar11.raw._0_4_ = local_e0.parent.super_Schema.raw._0_4_;
        _::ListReader::getStructElement((StructReader *)auStack_1b0,&local_e0.list.reader,index_00);
        local_1c0._8_4_ = index_00;
        local_68.parent.super_Schema.raw._0_4_ = index_00 | 0x1000000;
        local_1c0._0_8_ = SVar11.raw;
        TVar14 = StructSchema::Field::getType((Field *)local_1c0);
        makeBrandDepInitializer((Maybe<kj::StringTree> *)&local_178,this,TVar14);
        local_200.ptr.isSet = local_178.raw._0_1_;
        if (local_178.raw._0_1_ == true) {
          local_200.ptr.field_1.value.size_ = local_170.value.size_;
          local_200.ptr.field_1.value.text.content.ptr = local_170.value.text.content.ptr;
          local_200.ptr.field_1.value.text.content.size_ = local_170.value.text.content.size_;
          local_200.ptr.field_1.value.text.content.disposer = local_170.value.text.content.disposer;
          local_170.value.text.content.ptr = (char *)0x0;
          local_170.value.text.content.size_ = 0;
          local_200.ptr.field_1.value.branches.ptr = local_170.value.branches.ptr;
          local_200.ptr.field_1.value.branches.size_ = local_170.value.branches.size_;
          local_200.ptr.field_1.value.branches.disposer = local_170.value.branches.disposer;
          local_170.value.branches.ptr = (Branch *)0x0;
          local_170.value.branches.size_ = 0;
          pmVar10 = std::
                    map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                    ::operator[](__return_storage_ptr__,(key_type_conflict *)&local_68);
          pmVar10->size_ = local_200.ptr.field_1.value.size_;
          pcVar2 = (pmVar10->text).content.ptr;
          if (pcVar2 != (char *)0x0) {
            sVar3 = (pmVar10->text).content.size_;
            (pmVar10->text).content.ptr = (char *)0x0;
            (pmVar10->text).content.size_ = 0;
            pAVar4 = (pmVar10->text).content.disposer;
            (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar2,1,sVar3,sVar3);
          }
          (pmVar10->text).content.ptr = local_200.ptr.field_1.value.text.content.ptr;
          (pmVar10->text).content.size_ = local_200.ptr.field_1.value.text.content.size_;
          (pmVar10->text).content.disposer = local_200.ptr.field_1.value.text.content.disposer;
          local_200.ptr.field_1.value.text.content.ptr = (char *)0x0;
          local_200.ptr.field_1.value.text.content.size_ = 0;
          pBVar5 = (pmVar10->branches).ptr;
          if (pBVar5 != (Branch *)0x0) {
            sVar3 = (pmVar10->branches).size_;
            (pmVar10->branches).ptr = (Branch *)0x0;
            (pmVar10->branches).size_ = 0;
            pAVar4 = (pmVar10->branches).disposer;
            (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pBVar5,0x40,sVar3,sVar3);
          }
          (pmVar10->branches).ptr = local_200.ptr.field_1.value.branches.ptr;
          (pmVar10->branches).size_ = local_200.ptr.field_1.value.branches.size_;
          (pmVar10->branches).disposer = local_200.ptr.field_1.value.branches.disposer;
          local_200.ptr.field_1.value.branches.ptr = (Branch *)0x0;
          local_200.ptr.field_1.value.branches.size_ = 0;
        }
        uVar8 = local_200.ptr.field_1.value.branches.size_;
        uVar7 = local_200.ptr.field_1.value.branches.ptr;
        if (local_200.ptr.isSet == true) {
          if (local_200.ptr.field_1.value.branches.ptr != (Branch *)0x0) {
            local_200.ptr.field_1.value.branches.ptr = (Branch *)0x0;
            local_200.ptr.field_1.value.branches.size_ = 0;
            (**(local_200.ptr.field_1.value.branches.disposer)->_vptr_ArrayDisposer)
                      (local_200.ptr.field_1.value.branches.disposer,uVar7,0x40,uVar8,uVar8);
          }
          uVar8 = local_200.ptr.field_1.value.text.content.size_;
          uVar7 = local_200.ptr.field_1.value.text.content.ptr;
          if (local_200.ptr.field_1.value.text.content.ptr != (char *)0x0) {
            local_200.ptr.field_1.value.text.content.ptr = (char *)0x0;
            local_200.ptr.field_1.value.text.content.size_ = 0;
            (**(local_200.ptr.field_1.value.text.content.disposer)->_vptr_ArrayDisposer)
                      (local_200.ptr.field_1.value.text.content.disposer,uVar7,1,uVar8,uVar8);
          }
        }
        index_00 = index_00 + 1;
      } while (local_e0.list.reader.elementCount != index_00);
    }
  }
  else if (sVar9 == 3) {
    local_130.raw = (RawBrandedSchema *)Schema::asInterface(&local_138);
    InterfaceSchema::getSuperclasses(&local_e0,(InterfaceSchema *)&local_130);
    if ((ulong)local_e0.list.reader.elementCount != 0) {
      uVar13 = 0;
      do {
        local_178.raw = (RawBrandedSchema *)(CONCAT44(local_178.raw._4_4_,(uint)uVar13) | 0x4000000)
        ;
        SVar11.raw = (RawBrandedSchema *)
                     InterfaceSchema::SuperclassList::operator[](&local_e0,(uint)uVar13);
        makeBrandDepInitializer(&local_200,this,SVar11);
        local_1c0[0] = local_200.ptr.isSet;
        if (local_200.ptr.isSet == true) {
          local_1c0._8_8_ = local_200.ptr.field_1.value.size_;
          auStack_1b0._0_8_ = local_200.ptr.field_1.value.text.content.ptr;
          auStack_1b0._8_8_ = local_200.ptr.field_1.value.text.content.size_;
          auStack_1b0._16_8_ = local_200.ptr.field_1.value.text.content.disposer;
          local_200.ptr.field_1.value.text.content.ptr = (char *)0x0;
          local_200.ptr.field_1.value.text.content.size_ = 0;
          auStack_1b0._24_8_ = local_200.ptr.field_1.value.branches.ptr;
          auStack_1b0._32_8_ = local_200.ptr.field_1.value.branches.size_;
          auStack_1b0._40_8_ = local_200.ptr.field_1.value.branches.disposer;
          local_200.ptr.field_1.value.branches.ptr = (Branch *)0x0;
          local_200.ptr.field_1.value.branches.size_ = 0;
          pmVar10 = std::
                    map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                    ::operator[](__return_storage_ptr__,(key_type_conflict *)&local_178);
          pmVar10->size_ = local_1c0._8_8_;
          pcVar2 = (pmVar10->text).content.ptr;
          if (pcVar2 != (char *)0x0) {
            sVar3 = (pmVar10->text).content.size_;
            (pmVar10->text).content.ptr = (char *)0x0;
            (pmVar10->text).content.size_ = 0;
            pAVar4 = (pmVar10->text).content.disposer;
            (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar2,1,sVar3,sVar3);
          }
          (pmVar10->text).content.ptr = (char *)auStack_1b0._0_8_;
          (pmVar10->text).content.size_ = auStack_1b0._8_8_;
          (pmVar10->text).content.disposer = (ArrayDisposer *)auStack_1b0._16_8_;
          auStack_1b0._0_8_ = (SegmentReader *)0x0;
          auStack_1b0._8_8_ = (WirePointer *)0x0;
          pBVar5 = (pmVar10->branches).ptr;
          if (pBVar5 != (Branch *)0x0) {
            sVar3 = (pmVar10->branches).size_;
            (pmVar10->branches).ptr = (Branch *)0x0;
            (pmVar10->branches).size_ = 0;
            pAVar4 = (pmVar10->branches).disposer;
            (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pBVar5,0x40,sVar3,sVar3);
          }
          (pmVar10->branches).ptr = (Branch *)auStack_1b0._24_8_;
          (pmVar10->branches).size_ = auStack_1b0._32_8_;
          (pmVar10->branches).disposer = (ArrayDisposer *)auStack_1b0._40_8_;
          auStack_1b0._24_8_ = (WirePointer *)0x0;
          auStack_1b0._32_4_ = 0;
          auStack_1b0._36_2_ = 0;
          auStack_1b0._38_2_ = 0;
        }
        uVar8 = auStack_1b0._32_8_;
        uVar7 = auStack_1b0._24_8_;
        if (local_1c0[0] == '\x01') {
          if ((WirePointer *)auStack_1b0._24_8_ != (WirePointer *)0x0) {
            auStack_1b0._24_8_ = (WirePointer *)0x0;
            auStack_1b0._32_4_ = 0;
            auStack_1b0._36_2_ = 0;
            auStack_1b0._38_2_ = 0;
            (***(_func_int ***)auStack_1b0._40_8_)(auStack_1b0._40_8_,uVar7,0x40,uVar8,uVar8);
          }
          uVar8 = auStack_1b0._8_8_;
          uVar7 = auStack_1b0._0_8_;
          if ((SegmentReader *)auStack_1b0._0_8_ != (SegmentReader *)0x0) {
            auStack_1b0._0_8_ = (SegmentReader *)0x0;
            auStack_1b0._8_8_ = (WirePointer *)0x0;
            (***(_func_int ***)auStack_1b0._16_8_)(auStack_1b0._16_8_,uVar7,1,uVar8,uVar8);
          }
        }
        uVar13 = uVar13 + 1;
      } while (local_e0.list.reader.elementCount != uVar13);
    }
    InterfaceSchema::getMethods(&local_68,(InterfaceSchema *)&local_130);
    if ((ulong)local_68.list.reader.elementCount != 0) {
      uVar13 = 0;
      do {
        SVar6.raw._4_4_ = local_68.parent.super_Schema.raw._4_4_;
        SVar6.raw._0_4_ = (uint)local_68.parent.super_Schema.raw;
        index = (ElementCount)uVar13;
        _::ListReader::getStructElement((StructReader *)auStack_1b0,&local_68.list.reader,index);
        uVar7 = local_1c0._8_8_;
        uStack_120 = (undefined2)uVar13;
        local_1c0._8_2_ = uStack_120;
        uVar8 = local_1c0._8_8_;
        local_17c = index | 0x2000000;
        local_118 = (SegmentReader *)auStack_1b0._0_8_;
        pWStack_110 = (WirePointer *)auStack_1b0._8_8_;
        local_108 = (ArrayDisposer *)auStack_1b0._16_8_;
        pWStack_100 = (WirePointer *)auStack_1b0._24_8_;
        local_f8 = auStack_1b0._32_4_;
        SStack_f4 = auStack_1b0._36_2_;
        uStack_f2 = auStack_1b0._38_2_;
        pAStack_f0 = (ArrayDisposer *)auStack_1b0._40_8_;
        local_1c0._10_4_ = SUB84(uVar7,2);
        uStack_11e = local_1c0._10_4_;
        local_1c0._14_2_ = SUB82(uVar7,6);
        uStack_11a = local_1c0._14_2_;
        local_1c0._0_8_ = SVar6.raw;
        local_1c0._8_8_ = uVar8;
        local_128 = SVar6.raw;
        SVar12 = InterfaceSchema::Method::getParamType((Method *)local_1c0);
        method._10_4_ = uStack_11e;
        method.ordinal = uStack_120;
        method._14_2_ = uStack_11a;
        method.parent.super_Schema.raw = (Schema)(Schema)local_128;
        method.proto._reader.segment = local_118;
        method.proto._reader.capTable = (CapTableReader *)pWStack_110;
        method.proto._reader.data = local_108;
        method.proto._reader.pointers = pWStack_100;
        method.proto._reader.dataSize = local_f8;
        method.proto._reader.pointerCount = SStack_f4;
        method.proto._reader._38_2_ = uStack_f2;
        method.proto._reader._40_8_ = pAStack_f0;
        suffix.content.size_ = 7;
        suffix.content.ptr = "Params";
        makeBrandDepInitializer((Maybe<kj::StringTree> *)&local_178,this,method,SVar12,suffix);
        local_200.ptr.isSet = local_178.raw._0_1_;
        if (local_178.raw._0_1_ == true) {
          local_200.ptr.field_1.value.size_ = local_170.value.size_;
          local_200.ptr.field_1.value.text.content.ptr = local_170.value.text.content.ptr;
          local_200.ptr.field_1.value.text.content.size_ = local_170.value.text.content.size_;
          local_200.ptr.field_1.value.text.content.disposer = local_170.value.text.content.disposer;
          local_170.value.text.content.ptr = (char *)0x0;
          local_170.value.text.content.size_ = 0;
          local_200.ptr.field_1.value.branches.ptr = local_170.value.branches.ptr;
          local_200.ptr.field_1.value.branches.size_ = local_170.value.branches.size_;
          local_200.ptr.field_1.value.branches.disposer = local_170.value.branches.disposer;
          local_170.value.branches.ptr = (Branch *)0x0;
          local_170.value.branches.size_ = 0;
          pmVar10 = std::
                    map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                    ::operator[](__return_storage_ptr__,&local_17c);
          pmVar10->size_ = local_200.ptr.field_1.value.size_;
          pcVar2 = (pmVar10->text).content.ptr;
          if (pcVar2 != (char *)0x0) {
            sVar3 = (pmVar10->text).content.size_;
            (pmVar10->text).content.ptr = (char *)0x0;
            (pmVar10->text).content.size_ = 0;
            pAVar4 = (pmVar10->text).content.disposer;
            (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar2,1,sVar3,sVar3);
          }
          (pmVar10->text).content.ptr = local_200.ptr.field_1.value.text.content.ptr;
          (pmVar10->text).content.size_ = local_200.ptr.field_1.value.text.content.size_;
          (pmVar10->text).content.disposer = local_200.ptr.field_1.value.text.content.disposer;
          local_200.ptr.field_1.value.text.content.ptr = (char *)0x0;
          local_200.ptr.field_1.value.text.content.size_ = 0;
          pBVar5 = (pmVar10->branches).ptr;
          if (pBVar5 != (Branch *)0x0) {
            sVar3 = (pmVar10->branches).size_;
            (pmVar10->branches).ptr = (Branch *)0x0;
            (pmVar10->branches).size_ = 0;
            pAVar4 = (pmVar10->branches).disposer;
            (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pBVar5,0x40,sVar3,sVar3);
          }
          (pmVar10->branches).ptr = local_200.ptr.field_1.value.branches.ptr;
          (pmVar10->branches).size_ = local_200.ptr.field_1.value.branches.size_;
          (pmVar10->branches).disposer = local_200.ptr.field_1.value.branches.disposer;
          local_200.ptr.field_1.value.branches.ptr = (Branch *)0x0;
          local_200.ptr.field_1.value.branches.size_ = 0;
        }
        uVar8 = local_200.ptr.field_1.value.branches.size_;
        uVar7 = local_200.ptr.field_1.value.branches.ptr;
        if (local_200.ptr.isSet == true) {
          if (local_200.ptr.field_1.value.branches.ptr != (Branch *)0x0) {
            local_200.ptr.field_1.value.branches.ptr = (Branch *)0x0;
            local_200.ptr.field_1.value.branches.size_ = 0;
            (**(local_200.ptr.field_1.value.branches.disposer)->_vptr_ArrayDisposer)
                      (local_200.ptr.field_1.value.branches.disposer,uVar7,0x40,uVar8,uVar8);
          }
          uVar8 = local_200.ptr.field_1.value.text.content.size_;
          uVar7 = local_200.ptr.field_1.value.text.content.ptr;
          if (local_200.ptr.field_1.value.text.content.ptr != (char *)0x0) {
            local_200.ptr.field_1.value.text.content.ptr = (char *)0x0;
            local_200.ptr.field_1.value.text.content.size_ = 0;
            (**(local_200.ptr.field_1.value.text.content.disposer)->_vptr_ArrayDisposer)
                      (local_200.ptr.field_1.value.text.content.disposer,uVar7,1,uVar8,uVar8);
          }
        }
        local_17c = index | 0x3000000;
        local_a8 = (RawBrandedSchema *)local_1c0._0_8_;
        pCStack_a0 = (CapTableReader *)local_1c0._8_8_;
        local_98 = (SegmentReader *)auStack_1b0._0_8_;
        pWStack_90 = (WirePointer *)auStack_1b0._8_8_;
        local_88 = (ArrayDisposer *)auStack_1b0._16_8_;
        pWStack_80 = (WirePointer *)auStack_1b0._24_8_;
        local_78 = auStack_1b0._32_4_;
        SStack_74 = auStack_1b0._36_2_;
        uStack_72 = auStack_1b0._38_2_;
        pAStack_70 = (ArrayDisposer *)auStack_1b0._40_8_;
        SVar12 = InterfaceSchema::Method::getResultType((Method *)local_1c0);
        method_00._8_8_ = pCStack_a0;
        method_00.parent.super_Schema.raw = (Schema)(Schema)local_a8;
        method_00.proto._reader.segment = local_98;
        method_00.proto._reader.capTable = (CapTableReader *)pWStack_90;
        method_00.proto._reader.data = local_88;
        method_00.proto._reader.pointers = pWStack_80;
        method_00.proto._reader.dataSize = local_78;
        method_00.proto._reader.pointerCount = SStack_74;
        method_00.proto._reader._38_2_ = uStack_72;
        method_00.proto._reader._40_8_ = pAStack_70;
        suffix_00.content.size_ = 8;
        suffix_00.content.ptr = "Results";
        makeBrandDepInitializer((Maybe<kj::StringTree> *)&local_178,this,method_00,SVar12,suffix_00)
        ;
        local_200.ptr.isSet = local_178.raw._0_1_;
        if (local_178.raw._0_1_ == true) {
          local_200.ptr.field_1.value.size_ = local_170.value.size_;
          local_200.ptr.field_1.value.text.content.ptr = local_170.value.text.content.ptr;
          local_200.ptr.field_1.value.text.content.size_ = local_170.value.text.content.size_;
          local_200.ptr.field_1.value.text.content.disposer = local_170.value.text.content.disposer;
          local_170.value.text.content.ptr = (char *)0x0;
          local_170.value.text.content.size_ = 0;
          local_200.ptr.field_1.value.branches.ptr = local_170.value.branches.ptr;
          local_200.ptr.field_1.value.branches.size_ = local_170.value.branches.size_;
          local_200.ptr.field_1.value.branches.disposer = local_170.value.branches.disposer;
          local_170.value.branches.ptr = (Branch *)0x0;
          local_170.value.branches.size_ = 0;
          pmVar10 = std::
                    map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                    ::operator[](__return_storage_ptr__,&local_17c);
          pmVar10->size_ = local_200.ptr.field_1.value.size_;
          pcVar2 = (pmVar10->text).content.ptr;
          if (pcVar2 != (char *)0x0) {
            sVar3 = (pmVar10->text).content.size_;
            (pmVar10->text).content.ptr = (char *)0x0;
            (pmVar10->text).content.size_ = 0;
            pAVar4 = (pmVar10->text).content.disposer;
            (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar2,1,sVar3,sVar3);
          }
          (pmVar10->text).content.ptr = local_200.ptr.field_1.value.text.content.ptr;
          (pmVar10->text).content.size_ = local_200.ptr.field_1.value.text.content.size_;
          (pmVar10->text).content.disposer = local_200.ptr.field_1.value.text.content.disposer;
          local_200.ptr.field_1.value.text.content.ptr = (char *)0x0;
          local_200.ptr.field_1.value.text.content.size_ = 0;
          pBVar5 = (pmVar10->branches).ptr;
          if (pBVar5 != (Branch *)0x0) {
            sVar3 = (pmVar10->branches).size_;
            (pmVar10->branches).ptr = (Branch *)0x0;
            (pmVar10->branches).size_ = 0;
            pAVar4 = (pmVar10->branches).disposer;
            (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pBVar5,0x40,sVar3,sVar3);
          }
          (pmVar10->branches).ptr = local_200.ptr.field_1.value.branches.ptr;
          (pmVar10->branches).size_ = local_200.ptr.field_1.value.branches.size_;
          (pmVar10->branches).disposer = local_200.ptr.field_1.value.branches.disposer;
          local_200.ptr.field_1.value.branches.ptr = (Branch *)0x0;
          local_200.ptr.field_1.value.branches.size_ = 0;
        }
        uVar8 = local_200.ptr.field_1.value.branches.size_;
        uVar7 = local_200.ptr.field_1.value.branches.ptr;
        if (local_200.ptr.isSet == true) {
          if (local_200.ptr.field_1.value.branches.ptr != (Branch *)0x0) {
            local_200.ptr.field_1.value.branches.ptr = (Branch *)0x0;
            local_200.ptr.field_1.value.branches.size_ = 0;
            (**(local_200.ptr.field_1.value.branches.disposer)->_vptr_ArrayDisposer)
                      (local_200.ptr.field_1.value.branches.disposer,uVar7,0x40,uVar8,uVar8);
          }
          uVar8 = local_200.ptr.field_1.value.text.content.size_;
          uVar7 = local_200.ptr.field_1.value.text.content.ptr;
          if (local_200.ptr.field_1.value.text.content.ptr != (char *)0x0) {
            local_200.ptr.field_1.value.text.content.ptr = (char *)0x0;
            local_200.ptr.field_1.value.text.content.size_ = 0;
            (**(local_200.ptr.field_1.value.text.content.disposer)->_vptr_ArrayDisposer)
                      (local_200.ptr.field_1.value.text.content.disposer,uVar7,1,uVar8,uVar8);
          }
        }
        uVar13 = uVar13 + 1;
      } while (local_68.list.reader.elementCount != uVar13);
    }
  }
  else if (sVar9 == 4) {
    local_e0.parent.super_Schema.raw._0_4_ = 0x5000000;
    local_178.raw = (RawBrandedSchema *)Schema::asConst(&local_138);
    TVar14 = ConstSchema::getType((ConstSchema *)&local_178);
    makeBrandDepInitializer(&local_200,this,TVar14);
    local_1c0[0] = local_200.ptr.isSet;
    if (local_200.ptr.isSet == true) {
      local_1c0._8_8_ = local_200.ptr.field_1.value.size_;
      auStack_1b0._0_8_ = local_200.ptr.field_1.value.text.content.ptr;
      auStack_1b0._8_8_ = local_200.ptr.field_1.value.text.content.size_;
      auStack_1b0._16_8_ = local_200.ptr.field_1.value.text.content.disposer;
      auStack_1b0._24_8_ = local_200.ptr.field_1.value.branches.ptr;
      local_200.ptr.field_1.value.text.content.ptr = (char *)0x0;
      local_200.ptr.field_1.value.text.content.size_ = 0;
      auStack_1b0._32_8_ = local_200.ptr.field_1.value.branches.size_;
      auStack_1b0._40_8_ = local_200.ptr.field_1.value.branches.disposer;
      local_200.ptr.field_1.value.branches.ptr = (Branch *)0x0;
      local_200.ptr.field_1.value.branches.size_ = 0;
      pmVar10 = std::
                map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                ::operator[](__return_storage_ptr__,(key_type_conflict *)&local_e0);
      pmVar10->size_ = local_1c0._8_8_;
      pcVar2 = (pmVar10->text).content.ptr;
      if (pcVar2 != (char *)0x0) {
        sVar3 = (pmVar10->text).content.size_;
        (pmVar10->text).content.ptr = (char *)0x0;
        (pmVar10->text).content.size_ = 0;
        pAVar4 = (pmVar10->text).content.disposer;
        (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar2,1,sVar3,sVar3,0);
      }
      (pmVar10->text).content.ptr = (char *)auStack_1b0._0_8_;
      (pmVar10->text).content.size_ = auStack_1b0._8_8_;
      (pmVar10->text).content.disposer = (ArrayDisposer *)auStack_1b0._16_8_;
      auStack_1b0._0_8_ = (SegmentReader *)0x0;
      auStack_1b0._8_8_ = (WirePointer *)0x0;
      pBVar5 = (pmVar10->branches).ptr;
      if (pBVar5 != (Branch *)0x0) {
        sVar3 = (pmVar10->branches).size_;
        (pmVar10->branches).ptr = (Branch *)0x0;
        (pmVar10->branches).size_ = 0;
        pAVar4 = (pmVar10->branches).disposer;
        (**pAVar4->_vptr_ArrayDisposer)
                  (pAVar4,pBVar5,0x40,sVar3,sVar3,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      (pmVar10->branches).ptr = (Branch *)auStack_1b0._24_8_;
      (pmVar10->branches).size_ = auStack_1b0._32_8_;
      (pmVar10->branches).disposer = (ArrayDisposer *)auStack_1b0._40_8_;
      auStack_1b0._24_8_ = (WirePointer *)0x0;
      auStack_1b0._32_4_ = 0;
      auStack_1b0._36_2_ = 0;
      auStack_1b0._38_2_ = 0;
    }
    uVar8 = auStack_1b0._32_8_;
    uVar7 = auStack_1b0._24_8_;
    if (local_1c0[0] == '\x01') {
      if ((WirePointer *)auStack_1b0._24_8_ != (WirePointer *)0x0) {
        auStack_1b0._24_8_ = (WirePointer *)0x0;
        auStack_1b0._32_4_ = 0;
        auStack_1b0._36_2_ = 0;
        auStack_1b0._38_2_ = 0;
        (***(_func_int ***)auStack_1b0._40_8_)
                  (auStack_1b0._40_8_,uVar7,0x40,uVar8,uVar8,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      uVar8 = auStack_1b0._8_8_;
      uVar7 = auStack_1b0._0_8_;
      if ((SegmentReader *)auStack_1b0._0_8_ != (SegmentReader *)0x0) {
        auStack_1b0._0_8_ = (SegmentReader *)0x0;
        auStack_1b0._8_8_ = (WirePointer *)0x0;
        (***(_func_int ***)auStack_1b0._16_8_)(auStack_1b0._16_8_,uVar7,1,uVar8,uVar8,0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<uint, kj::StringTree>
  makeBrandDepMap(const TemplateContext& templateContext, Schema schema) {
    // Build deps. This is separate from makeBrandDepInitializers to give calling code the
    // opportunity to count the number of dependencies, to calculate array sizes.
    std::map<uint, kj::StringTree> depMap;

#define ADD_DEP(kind, index, ...) \
    { \
      uint location = _::RawBrandedSchema::makeDepLocation( \
          _::RawBrandedSchema::DepKind::kind, index); \
      KJ_IF_MAYBE(dep, makeBrandDepInitializer(__VA_ARGS__)) { \
        depMap[location] = kj::mv(*dep); \
      } \
    }

    switch (schema.getProto().which()) {
      case schema::Node::FILE:
      case schema::Node::ENUM:
      case schema::Node::ANNOTATION:
        break;

      case schema::Node::STRUCT:
        for (auto field: schema.asStruct().getFields()) {
          ADD_DEP(FIELD, field.getIndex(), field.getType());
        }
        break;
      case schema::Node::INTERFACE: {
        auto interface = schema.asInterface();
        auto superclasses = interface.getSuperclasses();
        for (auto i: kj::indices(superclasses)) {
          ADD_DEP(SUPERCLASS, i, superclasses[i]);
        }
        auto methods = interface.getMethods();
        for (auto i: kj::indices(methods)) {
          auto method = methods[i];
          ADD_DEP(METHOD_PARAMS, i, method, method.getParamType(), "Params");
          ADD_DEP(METHOD_RESULTS, i, method, method.getResultType(), "Results");
        }
        break;
      }
      case schema::Node::CONST:
        ADD_DEP(CONST_TYPE, 0, schema.asConst().getType());
        break;
    }
#undef ADD_DEP
    return depMap;
  }